

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<XMLNode,_std::default_delete<XMLNode>_> __thiscall XMLParser::parse_node(XMLParser *this)

{
  bool bVar1;
  XMLNode *this_00;
  pointer this_01;
  XMLParser *in_RSI;
  XMLParser local_48;
  undefined1 local_29;
  undefined1 local_28 [8];
  StringView name;
  XMLParser *this_local;
  unique_ptr<XMLNode,_std::default_delete<XMLNode>_> *node;
  
  _local_28 = parse_start_tag(in_RSI);
  local_29 = 0;
  this_00 = (XMLNode *)operator_new(0x58);
  XMLNode::XMLNode(this_00,(StringView *)local_28);
  std::unique_ptr<XMLNode,std::default_delete<XMLNode>>::
  unique_ptr<std::default_delete<XMLNode>,void>
            ((unique_ptr<XMLNode,std::default_delete<XMLNode>> *)this,this_00);
  parse_attributes(in_RSI,(unique_ptr<XMLNode,_std::default_delete<XMLNode>_> *)this);
  while (bVar1 = next_is_end_tag(in_RSI), ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = next_is_comment(in_RSI);
    if (bVar1) {
      parse_comment(in_RSI);
    }
    else {
      bVar1 = next_is_start_tag(in_RSI);
      if (bVar1) {
        this_01 = std::unique_ptr<XMLNode,_std::default_delete<XMLNode>_>::operator->
                            ((unique_ptr<XMLNode,_std::default_delete<XMLNode>_> *)this);
        parse_node(&local_48);
        XMLNode::add_child(this_01,(unique_ptr<XMLNode,_std::default_delete<XMLNode>_> *)&local_48);
        std::unique_ptr<XMLNode,_std::default_delete<XMLNode>_>::~unique_ptr
                  ((unique_ptr<XMLNode,_std::default_delete<XMLNode>_> *)&local_48);
      }
      else {
        parse_char_data(in_RSI);
      }
    }
  }
  parse_end_tag(in_RSI,(StringView *)local_28);
  return (__uniq_ptr_data<XMLNode,_std::default_delete<XMLNode>,_true,_true>)
         (__uniq_ptr_data<XMLNode,_std::default_delete<XMLNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<XMLNode> parse_node() {
		StringView name = parse_start_tag();
		std::unique_ptr<XMLNode> node(new XMLNode(name));
		parse_attributes(node);
		while (!next_is_end_tag()) {
			if (next_is_comment()) parse_comment();
			else if (next_is_start_tag()) node->add_child(parse_node());
			else parse_char_data();
		}
		parse_end_tag(name);
		return node;
	}